

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O1

void __thiscall
QPlainTextEditSearchWidget::setReplaceMode(QPlainTextEditSearchWidget *this,bool enabled)

{
  undefined7 in_register_00000031;
  ulong uVar1;
  
  uVar1 = CONCAT71(in_register_00000031,enabled);
  QAbstractButton::setChecked(SUB81(*(undefined8 *)(*(long *)(this + 0x28) + 0x40),0));
  (**(code **)(**(long **)(*(long *)(this + 0x28) + 0x30) + 0x68))
            (*(long **)(*(long *)(this + 0x28) + 0x30),uVar1 & 0xffffffff);
  (**(code **)(**(long **)(*(long *)(this + 0x28) + 0x10) + 0x68))
            (*(long **)(*(long *)(this + 0x28) + 0x10),uVar1 & 0xffffffff);
  (**(code **)(**(long **)(*(long *)(this + 0x28) + 0x58) + 0x68))
            (*(long **)(*(long *)(this + 0x28) + 0x58),uVar1 & 0xffffffff);
  (**(code **)(**(long **)(*(long *)(this + 0x28) + 0x60) + 0x68))
            (*(long **)(*(long *)(this + 0x28) + 0x60),uVar1 & 0xffffffff);
  (**(code **)(**(long **)(*(long *)(this + 0x28) + 0x50) + 0x68))
            (*(long **)(*(long *)(this + 0x28) + 0x50),uVar1 & 0xffffffff);
  return;
}

Assistant:

void QPlainTextEditSearchWidget::setReplaceMode(bool enabled) {
    ui->replaceToggleButton->setChecked(enabled);
    ui->replaceLabel->setVisible(enabled);
    ui->replaceLineEdit->setVisible(enabled);
    ui->modeLabel->setVisible(enabled);
    ui->buttonFrame->setVisible(enabled);
    ui->matchCaseSensitiveButton->setVisible(enabled);
}